

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O1

Aig_Obj_t * Saig_ObjHasUnlabeledFanout(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                  ,0x85,"Aig_Obj_t *Saig_ObjHasUnlabeledFanout(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (0x3f < *(uint *)&pObj->field_0x18) {
    uVar4 = *(uint *)&pObj->field_0x18 >> 6;
    uVar6 = 0xffffffff;
    iVar5 = 0;
    do {
      if (iVar5 == 0) {
        if (p->nFansAlloc <= pObj->Id) {
          __assert_fail("ObjId < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
        }
        iVar2 = pObj->Id * 5;
      }
      else {
        if (p->nFansAlloc <= (int)uVar6 / 2) {
          __assert_fail("iFan/2 < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
        }
        iVar2 = ((int)uVar6 >> 1) * 5 + (uVar6 & 1) + 3;
      }
      uVar6 = p->pFanData[iVar2];
      pVVar1 = p->vObjs;
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar7 = (int)uVar6 >> 1;
        if (((int)uVar7 < 0) || (pVVar1->nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar3 = (Aig_Obj_t *)pVVar1->pArray[uVar7];
      }
      if (((*(uint *)&pAVar3->field_0x18 & 7) == 3) && ((pAVar3->field_0).CioId < p->nTruePos)) {
        return pAVar3;
      }
      if (pAVar3->TravId != p->nTravIds) {
        return pAVar3;
      }
      iVar5 = iVar5 + 1;
    } while (uVar4 + (uVar4 == 0) != iVar5);
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

Aig_Obj_t * Saig_ObjHasUnlabeledFanout( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        if ( Saig_ObjIsPo(p, pFanout) || !Aig_ObjIsTravIdCurrent(p, pFanout) )
            return pFanout;
    return NULL;
}